

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cpp
# Opt level: O0

int __thiscall prmon::monitored_value::set_value(monitored_value *this,mon_value new_value)

{
  ulong in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string s_value;
  string s_new_value_1;
  string s_new_value;
  string s_offset;
  parameter *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  string local_208 [16];
  unsigned_long_long in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [48];
  string local_58 [32];
  string local_38 [32];
  ulong local_18;
  int local_4;
  
  if (in_RSI < in_RDI[4]._M_string_length) {
    std::__cxx11::to_string(in_stack_fffffffffffffe08);
    std::__cxx11::to_string(in_stack_fffffffffffffe08);
    parameter::get_name_abi_cxx11_(in_stack_fffffffffffffdc8);
    std::operator+(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    std::operator+(in_stack_fffffffffffffdd8,(char *)in_RDI);
    std::operator+(in_stack_fffffffffffffdd8,in_RDI);
    std::operator+(in_stack_fffffffffffffdd8,(char *)in_RDI);
    std::operator+(in_stack_fffffffffffffdd8,in_RDI);
    spdlog::error<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31b2e2);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_128);
    local_4 = 1;
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_38);
  }
  else {
    local_18 = in_RSI - in_RDI[4]._M_string_length;
    if (((byte)in_RDI[3]._M_dataplus & 1) == 0) {
      in_RDI[3].field_2._M_allocated_capacity = local_18;
      if (*(ulong *)((long)&in_RDI[3].field_2 + 8) < in_RDI[3].field_2._M_allocated_capacity) {
        *(size_type *)((long)&in_RDI[3].field_2 + 8) = in_RDI[3].field_2._M_allocated_capacity;
      }
      *(size_type *)(in_RDI + 4) = in_RDI[3].field_2._M_allocated_capacity + *(long *)(in_RDI + 4);
      in_RDI[3]._M_string_length = in_RDI[3]._M_string_length + 1;
    }
    else {
      if (local_18 < in_RDI[3].field_2._M_allocated_capacity) {
        std::__cxx11::to_string(in_stack_fffffffffffffe08);
        std::__cxx11::to_string(in_stack_fffffffffffffe08);
        parameter::get_name_abi_cxx11_(in_stack_fffffffffffffdc8);
        std::operator+(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
        std::operator+(in_stack_fffffffffffffdd8,(char *)in_RDI);
        std::operator+(in_stack_fffffffffffffdd8,in_RDI);
        std::operator+(in_stack_fffffffffffffdd8,(char *)in_RDI);
        std::operator+(in_stack_fffffffffffffdd8,in_RDI);
        spdlog::error<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31b591);
        std::__cxx11::string::~string(local_188);
        std::__cxx11::string::~string(local_1a8);
        std::__cxx11::string::~string(local_1c8);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
        std::__cxx11::string::~string(local_208);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
        local_4 = 1;
        std::__cxx11::string::~string(local_168);
        std::__cxx11::string::~string(local_148);
        return local_4;
      }
      in_RDI[3].field_2._M_allocated_capacity = local_18;
      *(ulong *)((long)&in_RDI[3].field_2 + 8) = local_18;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int monitored_value::set_value(mon_value new_value) {
  // If we have an offset for this parameter then passing in
  // a set value less than this is illegal
  if (new_value < m_offset) {
    std::string s_offset = std::to_string(m_offset);
    std::string s_new_value = std::to_string(new_value);
    spdlog::error("Error: attempt to set value of " + m_param.get_name() +
                  " to " + s_new_value +
                  ", less than this parameter's offset of " + s_offset);
    return 1;
  }
  new_value -= m_offset;

  if (m_monotonic) {
    // Monotonic values only increase and never have useful
    // sums or average values based on iterations
    if (new_value < m_value) {
      std::string s_new_value = std::to_string(new_value);
      std::string s_value = std::to_string(m_value);
      spdlog::error(
          "Error: attempt to reduce the monitored value of monotonic " +
          m_param.get_name() + " from " + s_value + " to " + s_new_value);
      return 1;
    }
    m_value = new_value;
    m_max_value = new_value;
  } else {
    // Non-monotonic values can go up and down and have
    // useful average values
    m_value = new_value;
    if (m_value > m_max_value) m_max_value = m_value;
    m_summed_value += m_value;
    ++m_iterations;
  }
  return 0;
}